

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

void tt_cmap12_next(TT_CMap12 cmap)

{
  byte bVar1;
  uint uVar2;
  FT_Byte *pFVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  
  if (cmap->cur_charcode < 0xffffffff) {
    uVar4 = cmap->cur_group;
    uVar5 = cmap->cur_charcode + 1;
    while (uVar4 < cmap->num_groups) {
      pFVar3 = (cmap->cmap).data;
      lVar17 = uVar4 * 0xc;
      lVar7 = (ulong)pFVar3[lVar17 + 0x10] * 0x1000000;
      lVar14 = (ulong)pFVar3[lVar17 + 0x11] * 0x10000;
      uVar16 = (ulong)pFVar3[lVar17 + 0x12] * 0x100;
      bVar1 = pFVar3[lVar17 + 0x13];
      uVar11 = (ulong)bVar1;
      uVar2 = *(uint *)(pFVar3 + lVar17 + 0x14);
      uVar19 = (uint)pFVar3[lVar17 + 0x1a] << 8 |
               (uint)pFVar3[lVar17 + 0x19] << 0x10 | (uint)pFVar3[lVar17 + 0x18] << 0x18;
      iVar10 = pFVar3[lVar17 + 0x1b] + uVar19;
      uVar18 = lVar7 + lVar14 | uVar16 | uVar11;
      uVar12 = uVar18;
      if (uVar18 < uVar5) {
        uVar12 = uVar5;
      }
      iVar15 = (int)uVar16;
      iVar13 = (int)lVar14;
      iVar6 = (int)lVar7;
      uVar18 = (uVar18 - uVar12) + 0xffffffff;
      lVar9 = 0;
      while( true ) {
        if (((ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
                    ) < uVar12 + lVar9) || (uVar18 < ((ulong)pFVar3[lVar17 + 0x1b] | (ulong)uVar19))
           ) goto LAB_0016035e;
        iVar8 = (int)lVar9;
        if (((((((int)uVar12 + iVar10) - (uint)bVar1) - iVar15) - iVar13) - iVar6) + iVar8 != 0)
        break;
        if (0xfffffffe < uVar12 + lVar9) goto LAB_00160226;
        lVar9 = lVar9 + 1;
        uVar18 = uVar18 - 1;
      }
      uVar12 = uVar16 + uVar11 + lVar7 + lVar14;
      if (uVar12 < uVar5) {
        uVar12 = uVar5;
      }
      if (((((((int)uVar12 + iVar10) - (uint)bVar1) - iVar15) - iVar13) - iVar6) + iVar8 <
          (uint)((cmap->cmap).cmap.charmap.face)->num_glyphs) {
        uVar11 = ((uint)pFVar3[lVar17 + 0x12] << 8 |
                 (uint)pFVar3[lVar17 + 0x11] << 0x10 | (uint)pFVar3[lVar17 + 0x10] << 0x18) | uVar11
        ;
        uVar12 = uVar11;
        if (uVar11 < uVar5) {
          uVar12 = uVar5;
        }
        cmap->cur_charcode = uVar12 + lVar9;
        if (uVar11 < uVar5) {
          uVar11 = uVar5;
        }
        cmap->cur_gindex =
             iVar8 + (((((iVar10 + (int)uVar11) - (uint)bVar1) - iVar15) - iVar13) - iVar6);
        cmap->cur_group = uVar4;
        return;
      }
LAB_0016035e:
      uVar4 = uVar4 + 1;
      uVar11 = uVar16 + uVar11 + lVar7 + lVar14;
      if (uVar11 < uVar5) {
        uVar11 = uVar5;
      }
      uVar5 = uVar11 + lVar9;
    }
  }
LAB_00160226:
  cmap->valid = '\0';
  return;
}

Assistant:

static void
  tt_cmap12_next( TT_CMap12  cmap )
  {
    FT_Face   face = cmap->cmap.cmap.charmap.face;
    FT_Byte*  p;
    FT_ULong  start, end, start_id, char_code;
    FT_ULong  n;
    FT_UInt   gindex;


    if ( cmap->cur_charcode >= 0xFFFFFFFFUL )
      goto Fail;

    char_code = cmap->cur_charcode + 1;

    for ( n = cmap->cur_group; n < cmap->num_groups; n++ )
    {
      p        = cmap->cmap.data + 16 + 12 * n;
      start    = TT_NEXT_ULONG( p );
      end      = TT_NEXT_ULONG( p );
      start_id = TT_PEEK_ULONG( p );

      if ( char_code < start )
        char_code = start;

    Again:
      if ( char_code <= end )
      {
        /* ignore invalid group */
        if ( start_id > 0xFFFFFFFFUL - ( char_code - start ) )
          continue;

        gindex = (FT_UInt)( start_id + ( char_code - start ) );

        /* does first element of group point to `.notdef' glyph? */
        if ( gindex == 0 )
        {
          if ( char_code >= 0xFFFFFFFFUL )
            goto Fail;

          char_code++;
          goto Again;
        }

        /* if `gindex' is invalid, the remaining values */
        /* in this group are invalid, too               */
        if ( gindex >= (FT_UInt)face->num_glyphs )
        {
          gindex = 0;
          continue;
        }

        cmap->cur_charcode = char_code;
        cmap->cur_gindex   = gindex;
        cmap->cur_group    = n;

        return;
      }
    }

  Fail:
    cmap->valid = 0;
  }